

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testValid_Pipeline(void)

{
  bool bVar1;
  Pipeline *pPVar2;
  Model *m;
  Model *m_00;
  Model *m_01;
  Model *m_02;
  NeuralNetwork *this;
  ostream *poVar3;
  ostream *poVar4;
  NetworkUpdateParameters *pNVar5;
  LossLayer *this_00;
  CategoricalCrossEntropyLossLayer *this_01;
  ModelDescription *pMVar6;
  FeatureDescription *this_02;
  FeatureType *this_03;
  ArrayFeatureType *this_04;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  RepeatedPtrField<CoreML::Specification::Model> *this_05;
  undefined1 local_1d0 [40];
  TensorAttributes tensorAttributesD;
  Result res;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesB;
  string targetName;
  string softmaxOutputName;
  TensorAttributes tensorAttributesA;
  Model spec;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_68;
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesA.name = "A";
  tensorAttributesA.dimension = 3;
  tensorAttributesA._12_4_ = 0;
  tensorAttributesB.name = "B";
  tensorAttributesB.dimension = 1;
  tensorAttributesB._12_4_ = 0;
  tensorAttributesC.name = "C";
  tensorAttributesC.dimension = 1;
  tensorAttributesC._12_4_ = 0;
  tensorAttributesD.name = "D";
  tensorAttributesD.dimension = 3;
  tensorAttributesD._12_4_ = 0;
  pPVar2 = buildEmptyPipelineModelWithStringOutput(&spec,true,&tensorAttributesA,"E");
  spec.specificationversion_ = 4;
  this_05 = &pPVar2->models_;
  m = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this_05);
  m_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this_05);
  m_01 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this_05);
  m_02 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this_05);
  buildBasicNeuralNetworkModel(m,false,&tensorAttributesA,&tensorAttributesB,1,false,false);
  buildBasicNeuralNetworkModel(m_00,false,&tensorAttributesB,&tensorAttributesC,1,false,false);
  uVar7 = 1;
  this = buildBasicNeuralNetworkModel(m_01,true,&tensorAttributesC,&tensorAttributesD,1,false,false)
  ;
  buildBasicNearestNeighborClassifier(m_02,false,&tensorAttributesD,"E");
  CoreML::Model::validate((Result *)local_1d0,m);
  CoreML::Result::operator=(&res,(Result *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    CoreML::Model::validate((Result *)local_1d0,m_00);
    CoreML::Result::operator=(&res,(Result *)local_1d0);
    std::__cxx11::string::~string((string *)(local_1d0 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar4 = (ostream *)std::operator<<(poVar3,":");
      iVar8 = 0x984;
      goto LAB_00170463;
    }
    CoreML::Model::validate((Result *)local_1d0,m_01);
    CoreML::Result::operator=(&res,(Result *)local_1d0);
    std::__cxx11::string::~string((string *)(local_1d0 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar4 = (ostream *)std::operator<<(poVar3,":");
      iVar8 = 0x987;
    }
    else {
      CoreML::Model::validate((Result *)local_1d0,m_02);
      CoreML::Result::operator=(&res,(Result *)local_1d0);
      std::__cxx11::string::~string((string *)(local_1d0 + 8));
      bVar1 = CoreML::Result::good(&res);
      if (!bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                );
        poVar4 = (ostream *)std::operator<<(poVar3,":");
        iVar8 = 0x98a;
        goto LAB_00170463;
      }
      CoreML::Model::validate((Result *)local_1d0,&spec);
      CoreML::Result::operator=(&res,(Result *)local_1d0);
      std::__cxx11::string::~string((string *)(local_1d0 + 8));
      bVar1 = CoreML::Result::good(&res);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&softmaxOutputName,"softmax_out",(allocator<char> *)local_1d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targetName,"cce_target",(allocator<char> *)local_1d0);
        addSoftmaxLayer(m_01,"softmax",tensorAttributesD.name,softmaxOutputName._M_dataplus._M_p);
        pNVar5 = CoreML::Specification::NeuralNetwork::mutable_updateparams(this);
        this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::Add
                            (&pNVar5->losslayers_);
        CoreML::Specification::LossLayer::set_name(this_00,"cce_loss");
        this_01 = CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer
                            (this_00);
        CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input
                  (this_01,&softmaxOutputName);
        CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target(this_01,&targetName);
        pMVar6 = CoreML::Specification::Model::mutable_description(m_01);
        this_02 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                            (&pMVar6->traininginput_);
        CoreML::Specification::FeatureDescription::set_name(this_02,&targetName);
        this_03 = CoreML::Specification::FeatureDescription::mutable_type(this_02);
        this_04 = CoreML::Specification::FeatureType::mutable_multiarraytype(this_03);
        this_04->datatype_ = 0x20020;
        CoreML::Specification::ArrayFeatureType::add_shape(this_04,1);
        addLearningRate<CoreML::Specification::NeuralNetwork>
                  (this,kSgdOptimizer,0.699999988079071,0.0,1.0);
        local_68._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_68._M_impl.super__Rb_tree_header._M_header;
        local_68._M_impl._0_8_ = 0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_right =
             local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        addMiniBatchSize<CoreML::Specification::NeuralNetwork>
                  (this,kSgdOptimizer,10,5,100,
                   (set<long,_std::less<long>,_std::allocator<long>_> *)&local_68);
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree(&local_68);
        local_98._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_98._M_impl.super__Rb_tree_header._M_header;
        local_98._M_impl._0_8_ = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_right =
             local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        addEpochs<CoreML::Specification::NeuralNetwork>
                  (this,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree(&local_98);
        local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_c8._M_impl.super__Rb_tree_header._M_header;
        local_c8._M_impl._0_8_ = 0;
        local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
        addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
                  (this,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_c8
                  );
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree(&local_c8);
        CoreML::Model::validate((Result *)local_1d0,m_01);
        CoreML::Result::operator=(&res,(Result *)local_1d0);
        std::__cxx11::string::~string((string *)(local_1d0 + 8));
        bVar1 = CoreML::Result::good(&res);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x9a9);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,"(res).good()");
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        uVar7 = (uint)!bVar1;
        std::__cxx11::string::~string((string *)&targetName);
        std::__cxx11::string::~string((string *)&softmaxOutputName);
        goto LAB_001704a0;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar4 = (ostream *)std::operator<<(poVar3,":");
      iVar8 = 0x98e;
    }
    poVar3 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar9 = "!((res).good())";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar4 = (ostream *)std::operator<<(poVar3,":");
    iVar8 = 0x981;
LAB_00170463:
    poVar3 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar9 = "(res).good()";
  }
  poVar3 = std::operator<<(poVar3,pcVar9);
  poVar3 = std::operator<<(poVar3," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_001704a0:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return uVar7;
}

Assistant:

int testValid_Pipeline() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline = buildEmptyPipelineModelWithStringOutput(spec, true, &tensorAttributesA, "E");
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto m1 = pipeline->add_models();
    auto m2 = pipeline->add_models();
    auto m3 = pipeline->add_models();
    auto m4 = pipeline->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    (void)buildBasicNeuralNetworkModel(*m2, false, &tensorAttributesB, &tensorAttributesC);
    auto neuralNet = buildBasicNeuralNetworkModel(*m3, true, &tensorAttributesC, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m4, false, &tensorAttributesD, "E");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m3);
    ML_ASSERT_BAD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    // expect validation to pass!
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Add target to updatable neural network model (3rd) within pipeline
    std::string softmaxOutputName = "softmax_out";
    std::string targetName = "cce_target";
    (void)addSoftmaxLayer(*m3, "softmax", tensorAttributesD.name, softmaxOutputName.c_str());

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cce_loss");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxOutputName);
    ceLossLayer->set_target(targetName);

    auto trainingInput = (*m3).mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    return 0;
}